

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_cmp_key_str_test(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  void *tmp;
  void *local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  btree_kv_ops local_a8;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  tmp = (void *)0x0;
  btree_str_kv_get_kb64_vb64(&local_a8);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    pcVar3 = *(char **)((long)&DAT_00108da0 + lVar4);
    sVar2 = strlen(pcVar3);
    construct_key_ptr(pcVar3,(key_len_t)sVar2,(void *)((long)&local_c8 + lVar4));
  }
  iVar1 = (*local_a8.cmp)(&local_c8,&local_c8,(void *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4bf);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4bf,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(&local_c8,local_c0,(void *)0x0);
  if (iVar1 < 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4c3);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4c3,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(local_b8,local_b0,(void *)0x0);
  if (iVar1 != -6) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4c7);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp == ((int)strlen(keys[2]) - (int)strlen(keys[3]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4c7,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(&local_c8,local_b0,(void *)0x0);
  if (iVar1 < 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4cb);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4cb,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(&tmp,&local_c8,(void *)0x0);
  if (iVar1 != -1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4cf);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4cf,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(&local_c8,&tmp,(void *)0x0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x4d3);
    kv_cmp_key_str_test()::__test_pass = 1;
    __assert_fail("cmp == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x4d3,"void kv_cmp_key_str_test()");
  }
  iVar1 = (*local_a8.cmp)(&tmp,&tmp,(void *)0x0);
  if (iVar1 == 0) {
    freevars(&local_c8,4);
    memleak_end();
    pcVar3 = "%s PASSED\n";
    if (kv_cmp_key_str_test()::__test_pass != '\0') {
      pcVar3 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar3,"kv_cmp_key_str_test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x4d7);
  kv_cmp_key_str_test()::__test_pass = 1;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x4d7,"void kv_cmp_key_str_test()");
}

Assistant:

void kv_cmp_key_str_test()
{

    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    int cmp;
    const char *keys[] = {"string",
                          "srting",
                          "longstring",
                          "longstringsuffix"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);
    void *tmp = NULL;


    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // construct key_ptrs
    for (int i = 0; i < n; i++){
        // omit null terminator
        construct_key_ptr(keys[i], strlen(keys[i]), &key_ptrs[i]);
    }


    // compare strings equal length equal values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[1], NULL);
    TEST_CHK( cmp > 0 );

    // compare strings diff length equal substrings
    cmp = kv_ops->cmp(&key_ptrs[2], &key_ptrs[3], NULL);
    TEST_CHK(cmp == ((int)strlen(keys[2]) - (int)strlen(keys[3])) );

    // compare strings diff length diff substrings
    cmp = kv_ops->cmp(&key_ptrs[0], &key_ptrs[3], NULL);
    TEST_CHK( cmp > 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, &key_ptrs[0], NULL);
    TEST_CHK( cmp == -1 );

    // key2 is NULL
    cmp = kv_ops->cmp(&key_ptrs[0], &tmp, NULL);
    TEST_CHK( cmp == 1 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}